

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O2

ByteData *
cfd::core::GetPsbtOutput
          (ByteData *__return_storage_ptr__,ByteData *key_data,wally_psbt_output *output,
          bool *is_find)

{
  uchar uVar1;
  wally_map_item *pwVar2;
  CfdException *pCVar3;
  size_t sVar4;
  long lVar5;
  allocator local_e1;
  undefined1 local_e0 [32];
  vector<unsigned_char,_std::allocator<unsigned_char>_> pubkey;
  size_t index;
  Pubkey pk;
  vector<unsigned_char,_std::allocator<unsigned_char>_> pk_bytes;
  vector<unsigned_char,_std::allocator<unsigned_char>_> key;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  
  if (is_find != (bool *)0x0) {
    *is_find = false;
  }
  ByteData::GetBytes(&key,key_data);
  lVar5 = (long)key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  uVar1 = *key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (uVar1 == '\x02') {
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&pubkey,lVar5 - 1,
               (allocator_type *)local_e0);
    if ((long)pubkey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)pubkey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start != 0) {
      memcpy(pubkey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start,
             key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start + 1,
             (long)pubkey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)pubkey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start);
    }
    ByteData::ByteData((ByteData *)&local_48,&pubkey);
    Pubkey::Pubkey(&pk,(ByteData *)&local_48);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_48);
    Pubkey::GetData((ByteData *)local_e0,&pk);
    ByteData::GetBytes(&pk_bytes,(ByteData *)local_e0);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_e0);
    index = 0;
    ::std::__cxx11::string::string((string *)local_e0,"output bip32 pubkey",&local_e1);
    FindPsbtMap(&output->keypaths,&pk_bytes,(string *)local_e0,&index);
    ::std::__cxx11::string::~string((string *)local_e0);
    if (is_find != (bool *)0x0) {
      *is_find = true;
    }
    pwVar2 = (output->keypaths).items;
    ByteData::ByteData(__return_storage_ptr__,pwVar2[index].value,(uint32_t)pwVar2[index].value_len)
    ;
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&pk_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&pk);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&pubkey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    goto LAB_002e6e61;
  }
  if (uVar1 == '\x01') {
    if (lVar5 != 1) {
      local_e0._0_8_ = "cfdcore_psbt.cpp";
      local_e0._8_4_ = 0x5e4;
      local_e0._16_8_ = "GetPsbtOutput";
      logger::warn<>((CfdSourceLocation *)local_e0,"psbt invalid key format.");
      pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::__cxx11::string::string
                ((string *)local_e0,"psbt invalid key format error.",(allocator *)&pubkey);
      CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)local_e0);
      __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
    }
    sVar4 = output->witness_script_len;
    if (sVar4 == 0) {
      if (is_find == (bool *)0x0) {
        pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
        ByteData::GetHex_abi_cxx11_((string *)&pk,key_data);
        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &pubkey,"psbt target key ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pk);
        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_e0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&pubkey," not found error.");
        CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)local_e0);
        __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
      }
LAB_002e6e59:
      ByteData::ByteData(__return_storage_ptr__);
      goto LAB_002e6e61;
    }
    if (is_find != (bool *)0x0) {
      *is_find = true;
    }
    output = (wally_psbt_output *)&output->witness_script;
  }
  else {
    if (uVar1 != '\0') {
      pubkey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      ::std::__cxx11::string::string((string *)local_e0,"output unknowns",(allocator *)&pk);
      FindPsbtMap(&output->unknowns,&key,(string *)local_e0,(size_t *)&pubkey);
      ::std::__cxx11::string::~string((string *)local_e0);
      if (is_find != (bool *)0x0) {
        *is_find = true;
      }
      pwVar2 = (output->unknowns).items;
      ByteData::ByteData(__return_storage_ptr__,
                         pwVar2[(long)pubkey.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_start].value,
                         (uint32_t)
                         pwVar2[(long)pubkey.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_start].value_len);
      goto LAB_002e6e61;
    }
    if (lVar5 != 1) {
      local_e0._0_8_ = "cfdcore_psbt.cpp";
      local_e0._8_4_ = 0x5d4;
      local_e0._16_8_ = "GetPsbtOutput";
      logger::warn<>((CfdSourceLocation *)local_e0,"psbt invalid key format.");
      pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::__cxx11::string::string
                ((string *)local_e0,"psbt invalid key format error.",(allocator *)&pubkey);
      CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)local_e0);
      __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
    }
    sVar4 = output->redeem_script_len;
    if (sVar4 == 0) {
      if (is_find == (bool *)0x0) {
        pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
        ByteData::GetHex_abi_cxx11_((string *)&pk,key_data);
        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &pubkey,"psbt target key ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pk);
        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_e0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&pubkey," not found error.");
        CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)local_e0);
        __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
      }
      goto LAB_002e6e59;
    }
    if (is_find != (bool *)0x0) {
      *is_find = true;
    }
  }
  ByteData::ByteData(__return_storage_ptr__,output->redeem_script,(uint32_t)sVar4);
LAB_002e6e61:
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return __return_storage_ptr__;
}

Assistant:

static ByteData GetPsbtOutput(
    const ByteData &key_data, struct wally_psbt_output *output,
    bool *is_find) {
  if (is_find != nullptr) *is_find = false;
  const auto key = key_data.GetBytes();
  bool has_key_1byte = (key.size() == 1);
  if (key[0] == Psbt::kPsbtOutputRedeemScript) {
    if (!has_key_1byte) {
      warn(CFD_LOG_SOURCE, "psbt invalid key format.");
      throw CfdException(
          kCfdIllegalArgumentError, "psbt invalid key format error.");
    }
    if (output->redeem_script_len != 0) {
      if (is_find != nullptr) *is_find = true;
      return ByteData(
          output->redeem_script,
          static_cast<uint32_t>(output->redeem_script_len));
    } else if (is_find == nullptr) {
      throw CfdException(
          kCfdIllegalArgumentError,
          "psbt target key " + key_data.GetHex() + " not found error.");
    }
  } else if (key[0] == Psbt::kPsbtOutputWitnessScript) {
    if (!has_key_1byte) {
      warn(CFD_LOG_SOURCE, "psbt invalid key format.");
      throw CfdException(
          kCfdIllegalArgumentError, "psbt invalid key format error.");
    }
    if (output->witness_script_len != 0) {
      if (is_find != nullptr) *is_find = true;
      return ByteData(
          output->witness_script,
          static_cast<uint32_t>(output->witness_script_len));
    } else if (is_find == nullptr) {
      throw CfdException(
          kCfdIllegalArgumentError,
          "psbt target key " + key_data.GetHex() + " not found error.");
    }
  } else if (key[0] == Psbt::kPsbtOutputBip32Derivation) {
    std::vector<uint8_t> pubkey(key.size() - 1);
    if (pubkey.size() != 0) {
      memcpy(pubkey.data(), &key.data()[1], pubkey.size());
    }
    Pubkey pk(pubkey);
    auto pk_bytes = pk.GetData().GetBytes();
    size_t index = 0;
    try {
      FindPsbtMap(&output->keypaths, pk_bytes, "output bip32 pubkey", &index);
      if (is_find != nullptr) *is_find = true;
      return ByteData(
          output->keypaths.items[index].value,
          static_cast<uint32_t>(output->keypaths.items[index].value_len));
    } catch (const CfdException &except) {
      if ((is_find == nullptr) ||
          (except.GetErrorCode() != kCfdIllegalArgumentError)) {
        throw except;
      }
    }
  } else {
    size_t index = 0;
    try {
      FindPsbtMap(&output->unknowns, key, "output unknowns", &index);
      if (is_find != nullptr) *is_find = true;
      return ByteData(
          output->unknowns.items[index].value,
          static_cast<uint32_t>(output->unknowns.items[index].value_len));
    } catch (const CfdException &except) {
      if ((is_find == nullptr) ||
          (except.GetErrorCode() != kCfdIllegalArgumentError)) {
        throw except;
      }
    }
  }
  return ByteData();
}